

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_unit.cpp
# Opt level: O0

void test_cpp_rank_many(void **param_1)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_long> __l_00;
  bool bVar1;
  allocator_type *__a;
  iterator puVar2;
  Roaring *this;
  uint *begin;
  size_type sVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> expect_ranks;
  vector<unsigned_long,_std::allocator<unsigned_long>_> ranks;
  Roaring r1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> values;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  Roaring *in_stack_fffffffffffffeb0;
  Roaring *this_00;
  allocator_type *in_stack_fffffffffffffec0;
  size_type in_stack_fffffffffffffec8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__y;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_fffffffffffffed0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *__x;
  allocator_type *in_stack_fffffffffffffed8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffee0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  iterator in_stack_fffffffffffffee8;
  size_type in_stack_fffffffffffffef0;
  undefined1 *puVar4;
  undefined1 local_f9 [25];
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined1 *local_d0;
  undefined8 local_c8;
  undefined1 local_a1 [89];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined4 local_38;
  undefined8 *local_30;
  undefined8 local_28;
  
  local_48 = 0x270f0000007b;
  uStack_40 = 0xfffffff70000270f;
  local_38 = 0xffffffff;
  local_30 = &local_48;
  local_28 = 5;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x10b1b7);
  __l._M_len = in_stack_fffffffffffffef0;
  __l._M_array = in_stack_fffffffffffffee8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffee0,__l,in_stack_fffffffffffffed8);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x10b1e8);
  roaring::Roaring::Roaring(in_stack_fffffffffffffeb0);
  this_01 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&stack0xffffffffffffffe0;
  __a = (allocator_type *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_01);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10b218);
  roaring::Roaring::addMany
            (in_stack_fffffffffffffeb0,CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8)
             ,(uint32_t *)0x10b22d);
  puVar2 = (iterator)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_01);
  puVar4 = local_a1;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x10b24e);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x10b274);
  this_00 = (Roaring *)&stack0xffffffffffffffe0;
  this = (Roaring *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10b286);
  begin = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10b295);
  sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00);
  __y = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(begin + sVar3);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::data
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x10b2c2);
  roaring::Roaring::rank_many
            (this,begin,(uint32_t *)this_00,
             (uint64_t *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  local_f9._17_8_ = 2;
  uStack_e0 = 3;
  local_f9._1_8_ = 1;
  local_f9._9_8_ = 2;
  local_d8 = 4;
  local_d0 = local_f9 + 1;
  local_c8 = 5;
  __x = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_f9;
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x10b328);
  __l_00._M_len = (size_type)puVar4;
  __l_00._M_array = puVar2;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,__l_00,__a);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x10b356);
  bVar1 = std::operator==(__x,__y);
  _assert_true((unsigned_long)this,(char *)begin,(char *)this_00,
               CONCAT13(bVar1,(int3)in_stack_fffffffffffffeac));
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this);
  roaring::Roaring::~Roaring(this_00);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this);
  return;
}

Assistant:

DEFINE_TEST(test_cpp_rank_many) {
    std::vector<uint32_t> values = {123, 9999, 9999, 0xFFFFFFF7, 0xFFFFFFFF};
    Roaring r1;
    r1.addMany(values.size(), values.data());

    std::vector<uint64_t> ranks(values.size());
    r1.rank_many(values.data(), values.data() + values.size(), ranks.data());
    std::vector<uint64_t> expect_ranks{1, 2, 2, 3, 4};
    assert_true(ranks == expect_ranks);
}